

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_histogram.c
# Opt level: O3

REF_STATUS ref_histogram_add_fitness(REF_HISTOGRAM ref_histogram,REF_GRID ref_grid)

{
  REF_CELL ref_cell;
  REF_STATUS RVar1;
  uint uVar2;
  undefined8 uVar3;
  ulong uVar4;
  char *pcVar5;
  int cell;
  REF_DBL fitness;
  REF_INT nodes [27];
  REF_DBL local_b0;
  int local_a8 [30];
  
  if ((ref_grid->twod == 0) && (ref_grid->surf == 0)) {
    pcVar5 = "twod only";
    uVar2 = 6;
    uVar3 = 0x1d4;
    uVar4 = 6;
  }
  else {
    ref_cell = ref_grid->cell[3];
    if (0 < ref_cell->max) {
      cell = 0;
      do {
        RVar1 = ref_cell_nodes(ref_cell,cell,local_a8);
        if ((RVar1 == 0) && (ref_grid->node->part[local_a8[0]] == ref_grid->mpi->id)) {
          if ((ref_grid->twod == 0) && (ref_grid->surf == 0)) {
            local_b0 = 1.0;
          }
          else {
            uVar2 = ref_node_tri_fitness(ref_grid->node,local_a8,&local_b0);
            if (uVar2 != 0) {
              pcVar5 = "qual";
              uVar3 = 0x1db;
              goto LAB_0012a1e6;
            }
            if (local_b0 <= 0.0) goto LAB_0012a1a7;
          }
          uVar2 = ref_histogram_add(ref_histogram,local_b0);
          if (uVar2 != 0) {
            pcVar5 = "add";
            uVar3 = 0x1df;
            goto LAB_0012a1e6;
          }
        }
LAB_0012a1a7:
        cell = cell + 1;
      } while (cell < ref_cell->max);
    }
    uVar2 = ref_histogram_gather(ref_histogram,ref_grid->mpi);
    if (uVar2 == 0) {
      return 0;
    }
    pcVar5 = "gather";
    uVar3 = 0x1e3;
LAB_0012a1e6:
    uVar4 = (ulong)uVar2;
  }
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_histogram.c",uVar3
         ,"ref_histogram_add_fitness",uVar4,pcVar5);
  return uVar2;
}

Assistant:

REF_FCN REF_STATUS ref_histogram_add_fitness(REF_HISTOGRAM ref_histogram,
                                             REF_GRID ref_grid) {
  REF_CELL ref_cell;
  REF_INT cell;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_DBL fitness;

  if (ref_grid_twod(ref_grid) || ref_grid_surf(ref_grid)) {
    ref_cell = ref_grid_tri(ref_grid);
  } else {
    ref_cell = ref_grid_tet(ref_grid);
    RSS(REF_IMPLEMENT, "twod only");
  }
  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    if (ref_node_part(ref_grid_node(ref_grid), nodes[0]) ==
        ref_mpi_rank(ref_grid_mpi(ref_grid))) {
      if (ref_grid_twod(ref_grid) || ref_grid_surf(ref_grid)) {
        RSS(ref_node_tri_fitness(ref_grid_node(ref_grid), nodes, &fitness),
            "qual");
      } else {
        fitness = 1.0;
      }
      if (fitness > 0.0) RSS(ref_histogram_add(ref_histogram, fitness), "add");
    }
  }

  RSS(ref_histogram_gather(ref_histogram, ref_grid_mpi(ref_grid)), "gather");

  return REF_SUCCESS;
}